

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<ChannelInfo>::push(vec<ChannelInfo> *this,ChannelInfo *elem)

{
  ChannelInfo *pCVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = this->sz;
  if (uVar2 == this->cap) {
    uVar3 = 2;
    if (1 < uVar2) {
      uVar3 = (ulong)(uVar2 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar3;
    pCVar1 = (ChannelInfo *)realloc(this->data,uVar3 << 3);
    this->data = pCVar1;
    uVar2 = this->sz;
  }
  else {
    pCVar1 = this->data;
  }
  this->sz = uVar2 + 1;
  pCVar1[uVar2] = *elem;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}